

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::Add<int_const*>(RepeatedField<int> *this,int *begin,int *end)

{
  int *end_local;
  int *begin_local;
  RepeatedField<int> *this_local;
  
  AddForwardIterator<int_const*>(this,begin,end);
  return;
}

Assistant:

inline void RepeatedField<Element>::Add(Iter begin, Iter end) {
  if (std::is_base_of<
          std::forward_iterator_tag,
          typename std::iterator_traits<Iter>::iterator_category>::value) {
    AddForwardIterator(begin, end);
  } else {
    AddInputIterator(begin, end);
  }
}